

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SnapshotTextFormatter.cpp
# Opt level: O3

ostream * __thiscall
cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::print
          (SnapshotTextFormatterImpl *this,ostream *os,CaliperMetadataAccessInterface *db,
          vector<cali::Entry,_std::allocator<cali::Entry>_> *list)

{
  mutex *__mutex;
  Node *pNVar1;
  size_type sVar2;
  pointer pFVar3;
  pointer pFVar4;
  pthread_mutex_t *__mutex_00;
  bool bVar5;
  int iVar6;
  cali_attr_type cVar7;
  undefined4 extraout_var;
  cali_id_t cVar8;
  ostream *poVar9;
  size_t sVar10;
  char cVar11;
  pointer pFVar12;
  pointer this_00;
  Node *node;
  Node *pNVar13;
  char *pcVar14;
  string str;
  char *local_d0;
  long local_c8;
  char local_c0;
  undefined7 uStack_bf;
  string local_b0;
  ostream *local_90;
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  local_88;
  Variant local_68;
  pthread_mutex_t *local_50;
  SnapshotTextFormatterImpl *local_48;
  CaliperMetadataAccessInterface *local_40;
  pointer local_38;
  
  local_88.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &this->m_field_mutex;
  local_90 = os;
  local_40 = db;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  local_48 = this;
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
  ::
  _M_assign_aux<__gnu_cxx::__normal_iterator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field*,std::vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>>>
            ((vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>>
              *)&local_88,
             (this->m_fields).
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_fields).
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  local_38 = local_88.
             super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_88.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar5 = false;
    pFVar12 = local_88.
              super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_50 = (pthread_mutex_t *)__mutex;
    do {
      if ((pFVar12->attr_name)._M_string_length != 0) {
        iVar6 = (*local_40->_vptr_CaliperMetadataAccessInterface[2])(local_40,&pFVar12->attr_name);
        (pFVar12->attr).m_node = (Node *)CONCAT44(extraout_var,iVar6);
        (pFVar12->attr_name)._M_string_length = 0;
        *(pFVar12->attr_name)._M_dataplus._M_p = '\0';
        cVar7 = Attribute::type(&pFVar12->attr);
        if ((CALI_TYPE_DOUBLE < cVar7) || (cVar11 = 'r', (0x4cU >> (cVar7 & 0x1f) & 1) == 0)) {
          cVar11 = 'l';
          if (cVar7 == CALI_TYPE_ADDR) {
            cVar11 = 'r';
          }
        }
        pFVar12->align = cVar11;
        bVar5 = true;
      }
      local_c8 = 0;
      local_c0 = '\0';
      local_d0 = &local_c0;
      if ((pFVar12->attr).m_node != (Node *)0x0) {
        for (this_00 = (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl
                       .super__Vector_impl_data._M_start;
            this_00 !=
            (list->super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>)._M_impl.
            super__Vector_impl_data._M_finish; this_00 = this_00 + 1) {
          pNVar13 = (pFVar12->attr).m_node;
          if (pNVar13 == (Node *)0x0) {
            cVar8 = 0xffffffffffffffff;
          }
          else {
            cVar8 = pNVar13->m_id;
          }
          iVar6 = Entry::count(this_00,cVar8);
          if (iVar6 != 0) {
            pNVar13 = this_00->m_node;
            if (pNVar13 != (Node *)0x0) {
              if (pNVar13->m_attribute == 8) {
                local_68.m_v.type_and_size = (this_00->m_value).m_v.type_and_size;
                local_68.m_v.value = (this_00->m_value).m_v.value;
                Variant::to_string_abi_cxx11_(&local_b0,&local_68);
                std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                  operator_delete(local_b0._M_dataplus._M_p,
                                  local_b0.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                do {
                  pNVar1 = (pFVar12->attr).m_node;
                  if (pNVar1 == (Node *)0x0) {
                    cVar8 = 0xffffffffffffffff;
                  }
                  else {
                    cVar8 = pNVar1->m_id;
                  }
                  if (pNVar13->m_attribute == cVar8) {
                    local_68.m_v.type_and_size = (pNVar13->m_data).m_v.type_and_size;
                    local_68.m_v.value = (pNVar13->m_data).m_v.value;
                    Variant::to_string_abi_cxx11_(&local_b0,&local_68);
                    pcVar14 = (char *)std::__cxx11::string::append((char *)&local_b0);
                    std::__cxx11::string::_M_append(pcVar14,(ulong)local_d0);
                    std::__cxx11::string::_M_assign((string *)&local_d0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                      operator_delete(local_b0._M_dataplus._M_p,
                                      local_b0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pNVar13 = *(Node **)((long)&(((pNVar13->super_LockfreeIntrusiveTree<cali::Node>).
                                               m_me)->super_LockfreeIntrusiveTree<cali::Node>).m_me
                                      + (pNVar13->super_LockfreeIntrusiveTree<cali::Node>).m_node);
                } while (pNVar13 != (Node *)0x0);
              }
            }
            break;
          }
        }
      }
      iVar6 = pFVar12->width - (int)local_c8;
      if (0x4f < iVar6) {
        iVar6 = 0x50;
      }
      if (pFVar12->width <= (int)local_c8) {
        iVar6 = 0;
      }
      pcVar14 = (pFVar12->prefix)._M_dataplus._M_p;
      sVar2 = (pFVar12->prefix)._M_string_length;
      if (pFVar12->align == 'r') {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_90,pcVar14,sVar2);
        pcVar14 = "                                                                                "
                  + (0x50 - iVar6);
        if (iVar6 < 1) {
          pcVar14 = "";
        }
        sVar10 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,sVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_d0,local_c8);
      }
      else {
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(local_90,pcVar14,sVar2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_d0,local_c8);
        pcVar14 = "                                                                                "
                  + (0x50 - iVar6);
        if (iVar6 < 1) {
          pcVar14 = "";
        }
        sVar10 = strlen(pcVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar14,sVar10);
      }
      if (local_d0 != &local_c0) {
        operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
      }
      __mutex_00 = local_50;
      pFVar12 = pFVar12 + 1;
    } while (pFVar12 != local_38);
    if (bVar5) {
      iVar6 = pthread_mutex_lock(local_50);
      if (iVar6 != 0) {
        std::__throw_system_error(iVar6);
      }
      pFVar12 = (local_48->m_fields).
                super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (local_48->m_fields).
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pFVar3 = (local_48->m_fields).
               super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar4 = (local_48->m_fields).
               super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (local_48->m_fields).
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (local_48->m_fields).
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_start = pFVar3;
      local_88.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_finish = pFVar4;
      local_88.
      super__Vector_base<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pFVar12;
      pthread_mutex_unlock(__mutex_00);
    }
  }
  std::
  vector<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field,_std::allocator<cali::SnapshotTextFormatter::SnapshotTextFormatterImpl::Field>_>
  ::~vector(&local_88);
  return local_90;
}

Assistant:

std::ostream& print(std::ostream& os, const CaliperMetadataAccessInterface& db, const std::vector<Entry>& list)
    {
        std::vector<Field> fields;

        {
            std::lock_guard<std::mutex> g(m_field_mutex);

            fields.assign(m_fields.begin(), m_fields.end());
        }

        bool update = false;

        for (Field& f : fields) {
            if (!f.attr_name.empty()) {
                f.attr = db.get_attribute(f.attr_name);
                f.attr_name.clear();

                cali_attr_type type = f.attr.type();

                f.align = (type == CALI_TYPE_DOUBLE || type == CALI_TYPE_INT || type == CALI_TYPE_UINT
                           || type == CALI_TYPE_ADDR)
                              ? 'r'
                              : 'l';

                update = true;
            }

            std::string str;

            if (f.attr) {
                Entry e;

                for (auto it = list.begin(); it != list.end(); ++it)
                    if ((*it).count(f.attr)) {
                        e = *it;
                        break;
                    }

                if (e.is_reference()) {
                    for (const Node* node = e.node(); node; node = node->parent())
                        if (node->attribute() == f.attr.id())
                            str = node->data().to_string().append(str.size() ? "/" : "").append(str);
                } else if (e.is_immediate()) {
                    str.append(e.value().to_string());
                }
            }

            static const char whitespace[80 + 1] =
                "                                        "
                "                                        ";

            int len = str.size();
            int w   = len < f.width ? std::min<int>(f.width - len, 80) : 0;

            if (f.align == 'r')
                os << f.prefix << (w > 0 ? whitespace + (80 - w) : "") << str;
            else
                os << f.prefix << str << (w > 0 ? whitespace + (80 - w) : "");
        }

        if (update) {
            std::lock_guard<std::mutex> g(m_field_mutex);

            m_fields.swap(fields);
        }

        return os;
    }